

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

istream * operator>>(istream *i,Person *p)

{
  ostream *this;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  Address a;
  string id1;
  string name1;
  Person *p_local;
  istream *i_local;
  
  std::__cxx11::string::string((string *)(id1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(a.street.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"",&local_139);
  Address::Address((Address *)local_b8,&local_d8,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::operator<<((ostream *)&std::cout,"Enter name: ");
  std::operator>>(i,(string *)(id1.field_2._M_local_buf + 8));
  std::operator<<((ostream *)&std::cout,"Enter id: ");
  std::operator>>(i,(string *)(a.street.field_2._M_local_buf + 8));
  this = std::operator<<((ostream *)&std::cout,"Enter address: ");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  operator>>(i,(Address *)local_b8);
  Person::setName(p,(string *)((long)&id1.field_2 + 8));
  Person::setId(p,(string *)((long)&a.street.field_2 + 8));
  Person::setAddress(p,(Address *)local_b8);
  Address::~Address((Address *)local_b8);
  std::__cxx11::string::~string((string *)(a.street.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(id1.field_2._M_local_buf + 8));
  return i;
}

Assistant:

istream& operator >>(istream& i, Person& p) {

    string name1, id1;
    Address a("", "", "");
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    return i;
}